

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterATT.c
# Opt level: O3

ZyanStatus
ZydisFormatterATTPrintRegister
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context,
          ZydisRegister reg)

{
  void **ppvVar1;
  ZyanUSize ZVar2;
  void *pvVar3;
  ZyanStatus ZVar4;
  ZydisShortString *pZVar5;
  ulong uVar6;
  ZydisShortString *source;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x15f,
                  "ZyanStatus ZydisFormatterATTPrintRegister(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *, ZydisRegister)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x160,
                  "ZyanStatus ZydisFormatterATTPrintRegister(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *, ZydisRegister)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x161,
                  "ZyanStatus ZydisFormatterATTPrintRegister(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *, ZydisRegister)"
                 );
  }
  if (buffer->is_token_list == '\0') {
    if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) {
      __assert_fail("!destination->vector.allocator",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                    ,0xeb,
                    "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
    }
    ZVar2 = (buffer->string).vector.size;
    if (ZVar2 == 0) {
      __assert_fail("destination->vector.size && source->size",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                    ,0xec,
                    "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
    }
    if ((buffer->string).vector.capacity < ZVar2 + 1) {
      return 0x80100009;
    }
    *(undefined2 *)((long)(buffer->string).vector.data + (ZVar2 - 1)) = 0x25;
    ZVar2 = (buffer->string).vector.size;
    pvVar3 = (buffer->string).vector.data;
    (buffer->string).vector.size = ZVar2 + 1;
    if (*(char *)((long)pvVar3 + ZVar2) != '\0') {
      __assert_fail("*(char*)((ZyanU8*)(destination)->vector.data + (destination)->vector.size - 1) == \'\\0\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                    ,0xf7,
                    "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
    }
  }
  else {
    ZVar2 = (buffer->string).vector.size;
    if (0xfe < ZVar2 - 1) {
      __assert_fail("(len > 0) && (len < 256)",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/FormatterBase.h"
                    ,0xe7,
                    "ZyanStatus ZydisFormatterBufferAppendPredefined(ZydisFormatterBuffer *, const ZydisPredefinedToken *)"
                   );
    }
    if (buffer->capacity <= ZVar2 + 4) {
      return 0x80100009;
    }
    pvVar3 = (buffer->string).vector.data;
    *(char *)((long)pvVar3 + -1) = (char)ZVar2;
    *(undefined4 *)((long)pvVar3 + ZVar2) = 0x250007;
    uVar6 = buffer->capacity - (ZVar2 + 2);
    buffer->capacity = uVar6;
    ppvVar1 = &(buffer->string).vector.data;
    *ppvVar1 = (void *)((long)*ppvVar1 + ZVar2 + 2);
    (buffer->string).vector.size = 2;
    if (0xfe < uVar6) {
      uVar6 = 0xff;
    }
    (buffer->string).vector.capacity = uVar6;
  }
  pZVar5 = ZydisRegisterGetStringWrapped(reg);
  source = &STR_INVALID_REG;
  if (pZVar5 != (ZydisShortString *)0x0) {
    source = pZVar5;
  }
  ZVar4 = ZydisStringAppendShortCase(&buffer->string,source,formatter->case_registers);
  return ZVar4;
}

Assistant:

ZyanStatus ZydisFormatterATTPrintRegister(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context, ZydisRegister reg)
{
    ZYAN_UNUSED(context);

    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    ZYDIS_BUFFER_APPEND(buffer, REGISTER);
    const ZydisShortString* str = ZydisRegisterGetStringWrapped(reg);
    if (!str)
    {
        return ZydisStringAppendShortCase(&buffer->string, &STR_INVALID_REG,
            formatter->case_registers);
    }
    return ZydisStringAppendShortCase(&buffer->string, str, formatter->case_registers);
}